

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::AttachShader::AttachShader
          (AttachShader *this,SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program,
          SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader,bool useSync,bool serverSync)

{
  Shader *pSVar1;
  Program *pPVar2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_58;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_48 [2];
  undefined1 local_22;
  undefined1 local_21;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *pSStack_20;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program_local;
  AttachShader *this_local;
  
  local_22 = serverSync;
  local_21 = useSync;
  pSStack_20 = shader;
  shader_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)program;
  program_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)this;
  Operation::Operation(&this->super_Operation,"AttachShader",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__AttachShader_00670330;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr(&this->m_program,program);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr(&this->m_shader,shader);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Program>
            (local_48,&this->m_program);
  Operation::modifyGLObject(&this->super_Operation,local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>
            (&local_58,&this->m_shader);
  Operation::readGLObject(&this->super_Operation,&local_58);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(&local_58);
  pSVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
  if (pSVar1->type == 0x8b31) {
    pPVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator=(&pPVar2->vertexShader,shader);
  }
  else {
    pSVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
    if (pSVar1->type == 0x8b30) {
      pPVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator=(&pPVar2->fragmentShader,shader);
    }
  }
  return;
}

Assistant:

AttachShader::AttachShader (SharedPtr<Program> program, SharedPtr<Shader> shader, bool useSync, bool serverSync)
	: Operation	("AttachShader", useSync, serverSync)
	, m_program	(program)
	, m_shader	(shader)
{
	modifyGLObject(SharedPtr<Object>(m_program));
	readGLObject(SharedPtr<Object>(m_shader));

	if (m_shader->type == GL_VERTEX_SHADER)
		m_program->vertexShader = shader;
	else if (m_shader->type == GL_FRAGMENT_SHADER)
		m_program->fragmentShader = shader;
	else
		DE_ASSERT(false);
}